

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr elem,int copyChildren,xmlChar *targetBase)

{
  xmlElementType xVar1;
  int iVar2;
  xmlXIncludeRefPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr pxVar5;
  int iVar6;
  xmlNodePtr parent;
  xmlNodePtr pxVar7;
  _xmlNode *node;
  _xmlNode **pp_Var8;
  xmlNodePtr local_48;
  
  node = elem;
  if ((copyChildren != 0) && (node = elem->children, node == (xmlNodePtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  local_48 = (xmlNodePtr)0x0;
  pxVar7 = (xmlNodePtr)0x0;
  iVar6 = 0;
  parent = (xmlNodePtr)0x0;
LAB_001ad515:
  do {
    xVar1 = node->type;
    pxVar5 = pxVar7;
    if ((xVar1 != XML_DTD_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
      if (((xVar1 == XML_ELEMENT_NODE) &&
          ((node->ns != (xmlNs *)0x0 &&
           (iVar2 = xmlStrEqual(node->name,(xmlChar *)"include"), iVar2 != 0)))) &&
         ((iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar2 != 0 ||
          (iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar2 != 0)))) {
        pxVar3 = xmlXIncludeExpandNode(ctxt,node);
        if (pxVar3 == (xmlXIncludeRefPtr)0x0) goto LAB_001ad72f;
        pp_Var8 = &pxVar3->inc;
        while (pxVar7 = *pp_Var8, pxVar7 != (xmlNodePtr)0x0) {
          pxVar4 = xmlStaticCopyNode(pxVar7,ctxt->doc,parent,1);
          if (pxVar4 == (xmlNodePtr)0x0) goto LAB_001ad725;
          if (local_48 == (xmlNodePtr)0x0) {
            local_48 = pxVar4;
          }
          if (pxVar5 == (xmlNodePtr)0x0) {
            if (parent != (xmlNodePtr)0x0) {
              parent->children = pxVar4;
            }
          }
          else {
            pxVar5->next = pxVar4;
            pxVar4->prev = pxVar5;
          }
          if (iVar6 == 0 && targetBase != (xmlChar *)0x0) {
            xmlXIncludeBaseFixup(ctxt,pxVar7,pxVar4,targetBase);
          }
          pxVar5 = pxVar4;
          pp_Var8 = &pxVar7->next;
        }
      }
      else {
        pxVar5 = xmlStaticCopyNode(node,ctxt->doc,parent,2);
        if (pxVar5 == (xmlNodePtr)0x0) {
LAB_001ad725:
          xmlXIncludeErrMemory(ctxt);
LAB_001ad72f:
          xmlFreeNodeList(local_48);
          return (xmlNodePtr)0x0;
        }
        if (local_48 == (xmlNodePtr)0x0) {
          local_48 = pxVar5;
        }
        if (pxVar7 == (xmlNodePtr)0x0) {
          if (parent != (xmlNodePtr)0x0) {
            parent->children = pxVar5;
          }
        }
        else {
          pxVar7->next = pxVar5;
          pxVar5->prev = pxVar7;
        }
        if (iVar6 == 0 && targetBase != (xmlChar *)0x0) {
          xmlXIncludeBaseFixup(ctxt,node,pxVar5,targetBase);
        }
        if ((node->type != XML_ENTITY_REF_NODE) && (node->children != (_xmlNode *)0x0)) {
          iVar6 = iVar6 + 1;
          pxVar7 = (xmlNodePtr)0x0;
          parent = pxVar5;
          node = node->children;
          goto LAB_001ad515;
        }
      }
    }
    pxVar4 = parent;
    pxVar7 = pxVar5;
    pxVar5 = node;
    if (node == elem) {
      return local_48;
    }
    while (parent = pxVar4, node = pxVar5->next, node == (_xmlNode *)0x0) {
      if (parent != (xmlNodePtr)0x0) {
        parent->last = pxVar7;
      }
      pxVar5 = pxVar5->parent;
      if (pxVar5 == elem) {
        return local_48;
      }
      iVar6 = iVar6 + -1;
      pxVar4 = parent->parent;
      pxVar7 = parent;
    }
  } while( true );
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr elem,
                    int copyChildren, const xmlChar *targetBase) {
    xmlNodePtr result = NULL;
    xmlNodePtr insertParent = NULL;
    xmlNodePtr insertLast = NULL;
    xmlNodePtr cur;
    xmlNodePtr item;
    int depth = 0;

    if (copyChildren) {
        cur = elem->children;
        if (cur == NULL)
            return(NULL);
    } else {
        cur = elem;
    }

    while (1) {
        xmlNodePtr copy = NULL;
        int recurse = 0;

        if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_DTD_NODE)) {
            ;
        } else if ((cur->type == XML_ELEMENT_NODE) &&
                   (cur->ns != NULL) &&
                   (xmlStrEqual(cur->name, XINCLUDE_NODE)) &&
                   ((xmlStrEqual(cur->ns->href, XINCLUDE_NS)) ||
                    (xmlStrEqual(cur->ns->href, XINCLUDE_OLD_NS)))) {
            xmlXIncludeRefPtr ref = xmlXIncludeExpandNode(ctxt, cur);

            if (ref == NULL)
                goto error;
            /*
             * TODO: Insert XML_XINCLUDE_START and XML_XINCLUDE_END nodes
             */
            for (item = ref->inc; item != NULL; item = item->next) {
                copy = xmlStaticCopyNode(item, ctxt->doc, insertParent, 1);
                if (copy == NULL) {
                    xmlXIncludeErrMemory(ctxt);
                    goto error;
                }

                if (result == NULL)
                    result = copy;
                if (insertLast != NULL) {
                    insertLast->next = copy;
                    copy->prev = insertLast;
                } else if (insertParent != NULL) {
                    insertParent->children = copy;
                }
                insertLast = copy;

                if ((depth == 0) && (targetBase != NULL))
                    xmlXIncludeBaseFixup(ctxt, item, copy, targetBase);
            }
        } else {
            copy = xmlStaticCopyNode(cur, ctxt->doc, insertParent, 2);
            if (copy == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto error;
            }

            if (result == NULL)
                result = copy;
            if (insertLast != NULL) {
                insertLast->next = copy;
                copy->prev = insertLast;
            } else if (insertParent != NULL) {
                insertParent->children = copy;
            }
            insertLast = copy;

            if ((depth == 0) && (targetBase != NULL))
                xmlXIncludeBaseFixup(ctxt, cur, copy, targetBase);

            recurse = (cur->type != XML_ENTITY_REF_NODE) &&
                      (cur->children != NULL);
        }

        if (recurse) {
            cur = cur->children;
            insertParent = insertLast;
            insertLast = NULL;
            depth += 1;
            continue;
        }

        if (cur == elem)
            return(result);

        while (cur->next == NULL) {
            if (insertParent != NULL)
                insertParent->last = insertLast;
            cur = cur->parent;
            if (cur == elem)
                return(result);
            insertLast = insertParent;
            insertParent = insertParent->parent;
            depth -= 1;
        }

        cur = cur->next;
    }

error:
    xmlFreeNodeList(result);
    return(NULL);
}